

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv_write2(uv_write_t *req,uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle
             ,uv_write_cb cb)

{
  anon_union_16_2_bf76bca6_for_active_reqs *paVar1;
  void **ppvVar2;
  uv_handle_type uVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  uv_buf_t *__dest;
  size_t sVar7;
  int iVar8;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x574,
                  "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                 );
  }
  uVar3 = stream->type;
  if ((UV_TTY < uVar3) || ((0x5080U >> (uVar3 & (UV_SIGNAL|UV_UDP)) & 1) == 0)) {
    __assert_fail("(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY) && \"uv_write (unix) does not yet support other types of streams\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x578,
                  "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                 );
  }
  if ((stream->io_watcher).fd < 0) {
LAB_004c7c0d:
    iVar8 = -9;
  }
  else {
    if ((stream->flags & 0x8000) == 0) {
      return -0x20;
    }
    if (send_handle != (uv_stream_t *)0x0) {
      if (uVar3 != UV_NAMED_PIPE) {
        return -0x16;
      }
      if (*(int *)&stream[1].data == 0) {
        return -0x16;
      }
      uVar3 = send_handle->type;
      lVar6 = 0xb8;
      if ((uVar3 != UV_NAMED_PIPE) && (uVar3 != UV_TCP)) {
        if (uVar3 != UV_UDP) goto LAB_004c7c0d;
        lVar6 = 0xb0;
      }
      if (*(int *)((long)send_handle->handle_queue + lVar6 + -0x20) < 0) {
        return -9;
      }
    }
    sVar4 = stream->write_queue_size;
    req->type = UV_WRITE;
    paVar1 = &stream->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    req->cb = cb;
    req->handle = stream;
    req->error = 0;
    req->send_handle = send_handle;
    ppvVar2 = req->queue;
    req->queue[0] = ppvVar2;
    req->queue[1] = ppvVar2;
    __dest = req->bufsml;
    req->bufs = __dest;
    if (4 < nbufs) {
      __dest = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = __dest;
      if (__dest == (uv_buf_t *)0x0) {
        return -0xc;
      }
    }
    memcpy(__dest,bufs,(ulong)nbufs << 4);
    req->nbufs = nbufs;
    req->write_index = 0;
    sVar7 = uv__count_bufs(bufs,nbufs);
    stream->write_queue_size = stream->write_queue_size + sVar7;
    req->queue[0] = stream->write_queue;
    plVar5 = (long *)stream->write_queue[1];
    req->queue[1] = plVar5;
    *plVar5 = (long)ppvVar2;
    stream->write_queue[1] = ppvVar2;
    iVar8 = 0;
    if (stream->connect_req == (uv_connect_t *)0x0) {
      iVar8 = 0;
      if (sVar4 == 0) {
        uv__write(stream);
      }
      else {
        if ((stream->flags & 0x100000) != 0) {
          __assert_fail("!(stream->flags & UV_HANDLE_BLOCKING_WRITES)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x5c3,
                        "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                       );
        }
        uv__io_start(stream->loop,&stream->io_watcher,4);
      }
    }
  }
  return iVar8;
}

Assistant:

int uv_write2(uv_write_t* req,
              uv_stream_t* stream,
              const uv_buf_t bufs[],
              unsigned int nbufs,
              uv_stream_t* send_handle,
              uv_write_cb cb) {
  int empty_queue;

  assert(nbufs > 0);
  assert((stream->type == UV_TCP ||
          stream->type == UV_NAMED_PIPE ||
          stream->type == UV_TTY) &&
         "uv_write (unix) does not yet support other types of streams");

  if (uv__stream_fd(stream) < 0)
    return UV_EBADF;

  if (!(stream->flags & UV_HANDLE_WRITABLE))
    return -EPIPE;

  if (send_handle) {
    if (stream->type != UV_NAMED_PIPE || !((uv_pipe_t*)stream)->ipc)
      return UV_EINVAL;

    /* XXX We abuse uv_write2() to send over UDP handles to child processes.
     * Don't call uv__stream_fd() on those handles, it's a macro that on OS X
     * evaluates to a function that operates on a uv_stream_t with a couple of
     * OS X specific fields. On other Unices it does (handle)->io_watcher.fd,
     * which works but only by accident.
     */
    if (uv__handle_fd((uv_handle_t*) send_handle) < 0)
      return UV_EBADF;

#if defined(__CYGWIN__) || defined(__MSYS__)
    /* Cygwin recvmsg always sets msg_controllen to zero, so we cannot send it.
       See https://github.com/mirror/newlib-cygwin/blob/86fc4bf0/winsup/cygwin/fhandler_socket.cc#L1736-L1743 */
    return UV_ENOSYS;
#endif
  }

  /* It's legal for write_queue_size > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up write_queue_size later, see also uv__write_req_finish().
   * We could check that write_queue is empty instead but that implies making
   * a write() syscall when we know that the handle is in error mode.
   */
  empty_queue = (stream->write_queue_size == 0);

  /* Initialize the req */
  uv__req_init(stream->loop, req, UV_WRITE);
  req->cb = cb;
  req->handle = stream;
  req->error = 0;
  req->send_handle = send_handle;
  QUEUE_INIT(&req->queue);

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  req->nbufs = nbufs;
  req->write_index = 0;
  stream->write_queue_size += uv__count_bufs(bufs, nbufs);

  /* Append the request to write_queue. */
  QUEUE_INSERT_TAIL(&stream->write_queue, &req->queue);

  /* If the queue was empty when this function began, we should attempt to
   * do the write immediately. Otherwise start the write_watcher and wait
   * for the fd to become writable.
   */
  if (stream->connect_req) {
    /* Still connecting, do nothing. */
  }
  else if (empty_queue) {
    uv__write(stream);
  }
  else {
    /*
     * blocking streams should never have anything in the queue.
     * if this assert fires then somehow the blocking stream isn't being
     * sufficiently flushed in uv__write.
     */
    assert(!(stream->flags & UV_HANDLE_BLOCKING_WRITES));
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  return 0;
}